

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O1

void __thiscall
boost::xpressive::
match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::~match_results(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *this)

{
  counted_base<boost::xpressive::detail::traits<char>_> *pcVar1;
  traits<char> *ptVar2;
  results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *that;
  
  std::
  vector<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
  ::~vector(&this->named_marks_);
  std::
  _Rb_tree<const_std::type_info_*,_std::pair<const_std::type_info_*const,_void_*>,_std::_Select1st<std::pair<const_std::type_info_*const,_void_*>_>,_boost::xpressive::detail::type_info_less,_std::allocator<std::pair<const_std::type_info_*const,_void_*>_>_>
  ::~_Rb_tree(&(this->args_)._M_t);
  ptVar2 = (this->traits_).px;
  if (ptVar2 != (traits<char> *)0x0) {
    LOCK();
    pcVar1 = &ptVar2->super_counted_base<boost::xpressive::detail::traits<char>_>;
    (pcVar1->count_).value_ = (pcVar1->count_).value_ + -1;
    UNLOCK();
    if ((pcVar1->count_).value_ == 0) {
      (*ptVar2->_vptr_traits[1])();
    }
  }
  that = (this->extras_ptr_).px;
  if (that != (results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
    detail::
    counted_base_access<boost::xpressive::detail::results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::release(&that->
               super_counted_base<boost::xpressive::detail::results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             );
  }
  while ((this->nested_results_).
         super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._sentry._next != (node_base *)&this->nested_results_) {
    detail::
    list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pop_front(&(this->nested_results_).
                 super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               );
  }
  if ((this->suffix_).super_type.m_initialized == true) {
    (this->suffix_).super_type.m_initialized = false;
  }
  if ((this->prefix_).super_type.m_initialized == true) {
    (this->prefix_).super_type.m_initialized = false;
  }
  if ((this->base_).super_type.m_initialized == true) {
    (this->base_).super_type.m_initialized = false;
  }
  return;
}

Assistant:

~match_results()
    {
    }